

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

Gia_Man_t * Gia_ManFaultUnfold(Gia_Man_t *p,int fUseMuxes,int fFfOnly)

{
  int iVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *__dest;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  Vec_Int_t *pVVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  Gia_Obj_t *pGVar20;
  
  p_00 = Gia_ManStart((fUseMuxes * 3 + 2) * p->nObjs);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      iVar15 = p->vCis->nSize;
      uVar10 = (iVar15 - iVar5) + iVar12;
      if (((int)uVar10 < 0) || (iVar15 <= (int)uVar10)) goto LAB_00538c4f;
      iVar15 = p->vCis->pArray[uVar10];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00538c30;
      pGVar20 = p->pObjs;
      if (pGVar20 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar11 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
      pGVar20[iVar15].Value = (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * 0x55555556;
      iVar12 = iVar12 + 1;
      iVar5 = p->nRegs;
    } while (iVar12 < iVar5);
  }
  pVVar8 = p->vCis;
  uVar11 = (ulong)(uint)pVVar8->nSize;
  if (iVar5 < pVVar8->nSize) {
    lVar17 = 0;
    do {
      if ((int)uVar11 <= lVar17) goto LAB_00538c4f;
      iVar5 = pVVar8->pArray[lVar17];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00538c30;
      pGVar20 = p->pObjs;
      if (pGVar20 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar11 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
      pGVar20[iVar5].Value = (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar8 = p->vCis;
      uVar11 = (ulong)pVVar8->nSize;
    } while (lVar17 < (long)(uVar11 - (long)p->nRegs));
  }
  uVar10 = p->nObjs;
  if (0 < (int)uVar10) {
    lVar18 = 8;
    lVar17 = 0;
    do {
      pGVar20 = p->pObjs;
      if (pGVar20 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)((long)pGVar20 + lVar18 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar10 = *(uint *)((long)pGVar20 +
                          lVar18 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar13 = *(uint *)((long)pGVar20 +
                              lVar18 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar13 < 0)) goto LAB_00538c6e;
        iVar5 = Gia_ManHashAnd(p_00,uVar10 ^ (uint)(uVar11 >> 0x1d) & 1,
                               uVar13 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar20->field_0x0 + lVar18) = iVar5;
        uVar10 = p->nObjs;
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar17 < (int)uVar10);
  }
  pVVar8 = p->vCos;
  iVar5 = pVVar8->nSize;
  if (0 < (long)iVar5) {
    piVar3 = pVVar8->pArray;
    lVar17 = 0;
    do {
      iVar12 = piVar3[lVar17];
      if (((long)iVar12 < 0) || ((int)uVar10 <= iVar12)) goto LAB_00538c30;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar20 = p->pObjs + iVar12;
      if ((int)pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value < 0)
      goto LAB_00538c6e;
      pGVar20->Value =
           (uint)*(undefined8 *)pGVar20 >> 0x1d & 1 ^
           pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value;
      lVar17 = lVar17 + 1;
    } while (iVar5 != lVar17);
  }
  iVar12 = p->nRegs;
  uVar11 = (ulong)iVar12;
  pVVar14 = p->vCis;
  iVar15 = pVVar14->nSize;
  if (0 < (long)uVar11) {
    uVar19 = (ulong)(uint)(iVar15 - iVar12);
    uVar16 = uVar11;
    do {
      if (((int)uVar19 < 0) || (iVar15 <= (int)uVar19)) goto LAB_00538c4f;
      iVar1 = pVVar14->pArray[uVar19];
      if (((long)iVar1 < 0) || ((int)uVar10 <= iVar1)) goto LAB_00538c30;
      pGVar20 = p->pObjs;
      if (pGVar20 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(undefined8 *)(pGVar20 + iVar1);
      if ((((uint)uVar4 & 0x9fffffff) != 0x9fffffff) ||
         (uVar13 = (uint)((ulong)uVar4 >> 0x20) & 0x1fffffff, (int)uVar13 < iVar15 - iVar12)) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar13 = uVar13 + (iVar5 - iVar15);
      if (((int)uVar13 < 0) || (iVar5 <= (int)uVar13)) goto LAB_00538c4f;
      uVar13 = pVVar8->pArray[uVar13];
      if (((long)(int)uVar13 < 0) || (uVar10 <= uVar13)) goto LAB_00538c30;
      pGVar20[iVar1].Value = pGVar20[(int)uVar13].Value;
      uVar19 = uVar19 + 1;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  if (iVar12 < iVar15) {
    lVar17 = 0;
    do {
      if (iVar15 <= lVar17) goto LAB_00538c4f;
      iVar5 = pVVar14->pArray[lVar17];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00538c30;
      pGVar20 = p->pObjs;
      if (pGVar20 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar11 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
      pGVar20[iVar5].Value = (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      uVar11 = (ulong)(uint)p->nRegs;
      pVVar14 = p->vCis;
      iVar15 = pVVar14->nSize;
    } while (lVar17 < iVar15 - p->nRegs);
  }
  iVar5 = p->nObjs;
  if (fFfOnly == 0) {
    if (0 < iVar5) {
      lVar18 = 8;
      lVar17 = 0;
      do {
        pGVar20 = p->pObjs;
        if (pGVar20 == (Gia_Obj_t *)0x0) break;
        uVar10 = *(uint *)((long)pGVar20 + lVar18 + -8);
        if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
          pGVar7 = Gia_ManAppendObj(p_00);
          uVar11 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar11 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar11 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar2 = p_00->pObjs;
          if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
          pGVar2 = p_00->pObjs;
          if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
          uVar11 = *(ulong *)((long)pGVar20 + lVar18 + -8);
          uVar10 = *(uint *)((long)pGVar20 + (ulong)(((uint)uVar11 & 0x1fffffff) << 2) * -3 + lVar18
                            );
          if (((int)uVar10 < 0) ||
             (uVar13 = *(uint *)((long)pGVar20 +
                                lVar18 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar13 < 0)) goto LAB_00538c6e;
          iVar5 = Gia_ManHashAnd(p_00,(uint)(uVar11 >> 0x1d) & 1 ^ uVar10,
                                 uVar13 ^ (uint)(uVar11 >> 0x3d) & 1);
          if (fUseMuxes != 0) {
            iVar5 = Gia_ManHashMux(p_00,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) *
                                        0x55555556,*(int *)(&pGVar20->field_0x0 + lVar18),iVar5);
          }
          *(int *)(&pGVar20->field_0x0 + lVar18) = iVar5;
        }
        lVar17 = lVar17 + 1;
        lVar18 = lVar18 + 0xc;
      } while (lVar17 < p->nObjs);
    }
    pVVar8 = p->vCos;
    if (0 < pVVar8->nSize) {
      lVar17 = 0;
      do {
        iVar5 = pVVar8->pArray[lVar17];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00538c30;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar20 = p->pObjs + iVar5;
        if ((int)pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value < 0)
        goto LAB_00538c6e;
        uVar10 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar20 >> 0x1d & 1 ^
                                      pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].
                                      Value);
        pGVar20->Value = uVar10;
        lVar17 = lVar17 + 1;
        pVVar8 = p->vCos;
      } while (lVar17 < pVVar8->nSize);
    }
  }
  else {
    if (0 < iVar5) {
      lVar18 = 8;
      lVar17 = 0;
      do {
        pGVar20 = p->pObjs;
        if (pGVar20 == (Gia_Obj_t *)0x0) break;
        uVar11 = *(ulong *)((long)pGVar20 + lVar18 + -8);
        if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
          uVar10 = *(uint *)((long)pGVar20 +
                            lVar18 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
          if (((int)uVar10 < 0) ||
             (uVar13 = *(uint *)((long)pGVar20 +
                                lVar18 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar13 < 0)) goto LAB_00538c6e;
          iVar5 = Gia_ManHashAnd(p_00,uVar10 ^ (uint)(uVar11 >> 0x1d) & 1,
                                 uVar13 ^ (uint)(uVar11 >> 0x3d) & 1);
          *(int *)(&pGVar20->field_0x0 + lVar18) = iVar5;
          iVar5 = p->nObjs;
        }
        lVar17 = lVar17 + 1;
        lVar18 = lVar18 + 0xc;
      } while (lVar17 < iVar5);
      uVar11 = (ulong)(uint)p->nRegs;
    }
    pVVar8 = p->vCos;
    iVar5 = pVVar8->nSize;
    if ((int)uVar11 < iVar5) {
      lVar17 = 0;
      do {
        if (iVar5 <= lVar17) goto LAB_00538c4f;
        iVar5 = pVVar8->pArray[lVar17];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00538c30;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar20 = p->pObjs + iVar5;
        if ((int)pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value < 0)
        goto LAB_00538c6e;
        uVar10 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar20 >> 0x1d & 1 ^
                                      pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].
                                      Value);
        pGVar20->Value = uVar10;
        lVar17 = lVar17 + 1;
        uVar11 = (ulong)(uint)p->nRegs;
        pVVar8 = p->vCos;
        iVar5 = pVVar8->nSize;
      } while (lVar17 < iVar5 - p->nRegs);
    }
    if (0 < (int)uVar11) {
      iVar5 = 0;
      do {
        iVar12 = p->vCos->nSize;
        uVar10 = (iVar12 - (int)uVar11) + iVar5;
        if (((int)uVar10 < 0) || (iVar12 <= (int)uVar10)) {
LAB_00538c4f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar12 = p->vCos->pArray[uVar10];
        if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_00538c30:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar20 = p->pObjs;
        if (pGVar20 == (Gia_Obj_t *)0x0) break;
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar11 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar11 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar11 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_00->pObjs;
        if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) {
LAB_00538c11:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = p_00->pObjs;
        if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_00538c11;
        pGVar20 = pGVar20 + iVar12;
        if ((int)pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value < 0) {
LAB_00538c6e:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        uVar10 = (uint)*(undefined8 *)pGVar20 >> 0x1d & 1 ^
                 pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value;
        if (fUseMuxes != 0) {
          uVar10 = Gia_ManHashMux(p_00,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * 0x55555556
                                  ,pGVar20->Value,uVar10);
        }
        pGVar20->Value = uVar10;
        uVar10 = Gia_ManAppendCo(p_00,uVar10);
        pGVar20->Value = uVar10;
        iVar5 = iVar5 + 1;
        uVar11 = (ulong)(uint)p->nRegs;
      } while (iVar5 < p->nRegs);
    }
  }
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar12 = p->nRegs;
  iVar15 = p->vCis->nSize;
  iVar5 = iVar12 + (iVar15 - iVar12) * 2;
  if (fFfOnly == 0) {
    iVar12 = ~(iVar15 + p->vCos->nSize) + p->nObjs;
  }
  if (pGVar9->vCis->nSize - pGVar9->nRegs != iVar5 + iVar12) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManRegNum(p) + 2 * Gia_ManPiNum(p) + (fFfOnly ? Gia_ManRegNum(p) : Gia_ManAndNum(p))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x177,"Gia_Man_t *Gia_ManFaultUnfold(Gia_Man_t *, int, int)");
  }
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManFaultUnfold( Gia_Man_t * p, int fUseMuxes, int fFfOnly )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl, iThis;
    pNew = Gia_ManStart( (2 + 3 * fUseMuxes) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    // add first timeframe
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // add second timeframe
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ObjRoToRi(p, pObj)->Value;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    if ( fFfOnly )
    {
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
        {
            iCtrl = Gia_ManAppendCi(pNew);
            iThis = Gia_ObjFanin0Copy(pObj);
            if ( fUseMuxes )
                pObj->Value = Gia_ManHashMux( pNew, iCtrl, pObj->Value, iThis );
            else
                pObj->Value = iThis;
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            iCtrl = Gia_ManAppendCi(pNew);
            iThis = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( fUseMuxes )
                pObj->Value = Gia_ManHashMux( pNew, iCtrl, pObj->Value, iThis );
            else
                pObj->Value = iThis;
        }
        Gia_ManForEachCo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManRegNum(p) + 2 * Gia_ManPiNum(p) + (fFfOnly ? Gia_ManRegNum(p) : Gia_ManAndNum(p)) );
    return pNew;
}